

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac.c
# Opt level: O3

int omac_init(EVP_MD_CTX *ctx,char *cipher_name)

{
  uint uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  
  puVar2 = (undefined8 *)EVP_MD_CTX_get0_md_data();
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[2] = cipher_name;
  uVar1 = OBJ_txt2nid(cipher_name);
  uVar3 = (ulong)uVar1;
  if (uVar1 == 0x4a6) {
    uVar3 = 8;
  }
  else {
    if (uVar1 != 0x3f7) goto LAB_00119249;
    uVar3 = 0x10;
  }
  puVar2[1] = uVar3;
LAB_00119249:
  return (int)uVar3;
}

Assistant:

static int omac_init(EVP_MD_CTX *ctx, const char *cipher_name)
{
    OMAC_CTX *c = EVP_MD_CTX_md_data(ctx);
    memset(c, 0, sizeof(OMAC_CTX));
    c->cipher_name = cipher_name;
    c->key_set = 0;

    switch (OBJ_txt2nid(cipher_name)) {
    case NID_magma_cbc:
        c->dgst_size = 8;
        break;

    case NID_grasshopper_cbc:
        c->dgst_size = 16;
        break;
    }

    return 1;
}